

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O1

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  long *local_188 [2];
  long local_178 [2];
  buffer<char> local_168;
  char local_148 [288];
  
  *(undefined ***)this = &PTR__spdlog_ex_00457120;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  (this->msg_)._M_string_length = 0;
  (this->msg_).field_2._M_local_buf[0] = '\0';
  local_168.size_ = 0;
  local_168._vptr_buffer = (_func_int **)&PTR_grow_00457278;
  local_168.capacity_ = 0xfa;
  local_168.ptr_ = local_148;
  ::fmt::v9::format_system_error(&local_168,last_errno,(msg->_M_dataplus)._M_p);
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,local_168.ptr_,local_168.ptr_ + local_168.size_);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)local_188);
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if (local_168.ptr_ != local_148) {
    operator_delete(local_168.ptr_,local_168.capacity_);
  }
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno) {
#ifdef SPDLOG_USE_STD_FORMAT
    msg_ = std::system_error(std::error_code(last_errno, std::generic_category()), msg).what();
#else
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg.c_str());
    msg_ = fmt::to_string(outbuf);
#endif
}